

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveInclude(Parser *parser,int flags)

{
  StringLiteral *this;
  pointer pEVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  size_type sVar5;
  string *str;
  undefined4 in_register_00000034;
  TextFile *file;
  string local_3e8;
  undefined1 local_3c8 [8];
  TextFile f;
  unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> local_e0;
  undefined1 local_d8 [8];
  StringLiteral encodingName;
  undefined1 local_b0 [4];
  Encoding encoding;
  undefined1 local_90 [8];
  path fileName;
  StringLiteral fileNameParameter;
  undefined1 local_40 [8];
  vector<Expression,_std::allocator<Expression>_> parameters;
  Token *start;
  int flags_local;
  Parser *parser_local;
  
  file = (TextFile *)CONCAT44(in_register_00000034,flags);
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Parser::peekToken((Parser *)file,0);
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_40);
  bVar2 = Parser::parseExpressionList
                    ((Parser *)file,(vector<Expression,_std::allocator<Expression>_> *)local_40,1,2)
  ;
  if (!bVar2) {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
    goto LAB_00208630;
  }
  this = (StringLiteral *)((long)&fileName._path.field_2 + 8);
  StringLiteral::StringLiteral(this);
  pvVar4 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                     ((vector<Expression,_std::allocator<Expression>_> *)local_40,0);
  bVar2 = Expression::evaluateString(pvVar4,this,true);
  if (bVar2) {
    StringLiteral::path((path *)local_b0,(StringLiteral *)((long)&fileName._path.field_2 + 8));
    getFullPathName((path *)local_90,(path *)local_b0);
    ghc::filesystem::path::~path((path *)local_b0);
    encodingName._value.field_2._12_4_ = 5;
    sVar5 = std::vector<Expression,_std::allocator<Expression>_>::size
                      ((vector<Expression,_std::allocator<Expression>_> *)local_40);
    if (sVar5 == 2) {
      StringLiteral::StringLiteral((StringLiteral *)local_d8);
      pvVar4 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                         ((vector<Expression,_std::allocator<Expression>_> *)local_40,1);
      bVar2 = Expression::evaluateString(pvVar4,(StringLiteral *)local_d8,true);
      if (bVar2) {
        str = StringLiteral::string_abi_cxx11_((StringLiteral *)local_d8);
        encodingName._value.field_2._12_4_ = getEncodingFromString(str);
      }
      else {
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
      }
      StringLiteral::~StringLiteral((StringLiteral *)local_d8);
      if (bVar2) goto LAB_002083c6;
    }
    else {
LAB_002083c6:
      bVar2 = Parser::isInsideTrueBlock((Parser *)file);
      if (bVar2) {
        bVar2 = ghc::filesystem::exists((path *)local_90);
        pEVar1 = parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (bVar2) {
          TextFile::TextFile((TextFile *)local_3c8);
          uVar3 = TextFile::open((TextFile *)local_3c8,local_90,0,
                                 (ulong)(uint)encodingName._value.field_2._12_4_);
          pEVar1 = parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if ((uVar3 & 1) == 0) {
            ghc::filesystem::path::u8string_abi_cxx11_(&local_3e8,(path *)local_90);
            Parser::printError<std::__cxx11::string>
                      ((Parser *)file,(Token *)pEVar1,"Could not open included file \"%s\"",
                       &local_3e8);
            std::__cxx11::string::~string((string *)&local_3e8);
            std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
            unique_ptr<std::default_delete<CAssemblerCommand>,void>
                      ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                       parser,(nullptr_t)0x0);
          }
          else {
            Parser::parseFile(parser,file,SUB81(local_3c8,0));
          }
          TextFile::~TextFile((TextFile *)local_3c8);
        }
        else {
          ghc::filesystem::path::u8string_abi_cxx11_((string *)&f.bufPos,(path *)local_90);
          Parser::printError<std::__cxx11::string>
                    ((Parser *)file,(Token *)pEVar1,"Included file \"%s\" does not exist",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f.bufPos)
          ;
          std::__cxx11::string::~string((string *)&f.bufPos);
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (nullptr_t)0x0);
        }
      }
      else {
        std::make_unique<DummyCommand>();
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   &local_e0);
        std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr(&local_e0);
      }
    }
    ghc::filesystem::path::~path((path *)local_90);
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  StringLiteral::~StringLiteral((StringLiteral *)((long)&fileName._path.field_2 + 8));
LAB_00208630:
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_40);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveInclude(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> parameters;
	if (!parser.parseExpressionList(parameters,1,2))
		return nullptr;

	StringLiteral fileNameParameter;
	if (!parameters[0].evaluateString(fileNameParameter,true))
		return nullptr;

	auto fileName = getFullPathName(fileNameParameter.path());

	TextFile::Encoding encoding = TextFile::GUESS;
	if (parameters.size() == 2)
	{
		StringLiteral encodingName;
		if (!parameters[1].evaluateString(encodingName,true))
			return nullptr;
		
		encoding = getEncodingFromString(encodingName.string());
	}

	// don't include the file if it's inside a false block
	if (!parser.isInsideTrueBlock())
		return std::make_unique<DummyCommand>();

	if (!fs::exists(fileName))
	{
		parser.printError(start, "Included file \"%s\" does not exist",fileName.u8string());
		return nullptr;
	}

	TextFile f;
	if (!f.open(fileName,TextFile::Read,encoding))
	{
		parser.printError(start, "Could not open included file \"%s\"",fileName.u8string());
		return nullptr;
	}

	return parser.parseFile(f);
}